

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# armformatter.cpp
# Opt level: O1

Error asmjit::v1_14::arm::FormatterInternal::formatRegisterList
                (String *sb,FormatFlags flags,BaseEmitter *emitter,Arch arch,RegType regType,
                uint32_t rMask)

{
  uint32_t rId;
  bool bVar1;
  Error EVar2;
  uint uVar3;
  Error EVar4;
  uint uVar5;
  FormatFlags FVar6;
  uint32_t rId_00;
  bool bVar7;
  
  EVar2 = String::_opChar(sb,kAppend,'{');
  if (EVar2 == 0) {
    bVar1 = true;
    do {
      FVar6 = kMachineCode;
      if (rMask == 0) {
        EVar2 = String::_opChar(sb,kAppend,'}');
        return EVar2;
      }
      rId = 0;
      if (rMask != 0) {
        for (; (rMask >> rId & 1) == 0; rId = rId + 1) {
        }
      }
      uVar3 = 1 << ((byte)rId & 0x1f);
      rId_00 = rId - 1;
      uVar5 = 0;
      do {
        rMask = rMask & ~uVar3;
        uVar3 = uVar3 * 2;
        uVar5 = uVar5 + 1;
        rId_00 = rId_00 + 1;
      } while ((rMask & uVar3) != 0);
      if (((bVar1) || (EVar4 = String::_opString(sb,kAppend,", ",0xffffffffffffffff), EVar4 == 0))
         && (EVar4 = formatRegister(sb,FVar6,emitter,arch,regType,rId,0,0xffffffff), EVar4 == 0)) {
        FVar6 = kMachineCode;
        if (uVar5 < 2) {
          bVar7 = true;
          bVar1 = false;
          EVar4 = EVar2;
        }
        else {
          EVar4 = String::_opChar(sb,kAppend,'-');
          if (EVar4 != 0) goto LAB_0012d90b;
          EVar4 = formatRegister(sb,FVar6,emitter,arch,regType,rId_00,0,0xffffffff);
          bVar7 = EVar4 == 0;
          if (bVar7) {
            bVar1 = false;
            EVar4 = EVar2;
          }
        }
      }
      else {
LAB_0012d90b:
        bVar7 = false;
      }
      EVar2 = EVar4;
    } while (bVar7);
  }
  return EVar2;
}

Assistant:

ASMJIT_FAVOR_SIZE Error FormatterInternal::formatRegisterList(
  String& sb,
  FormatFlags flags,
  const BaseEmitter* emitter,
  Arch arch,
  RegType regType,
  uint32_t rMask) noexcept {

  bool first = true;

  ASMJIT_PROPAGATE(sb.append('{'));
  while (rMask != 0u) {
    uint32_t start = Support::ctz(rMask);
    uint32_t count = 0u;

    uint32_t mask = 1u << start;
    do {
      rMask &= ~mask;
      mask <<= 1u;
      count++;
    } while (rMask & mask);

    if (!first)
      ASMJIT_PROPAGATE(sb.append(", "));

    ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, regType, start, 0, 0xFFFFFFFFu));
    if (count >= 2u) {
      ASMJIT_PROPAGATE(sb.append('-'));
      ASMJIT_PROPAGATE(formatRegister(sb, flags, emitter, arch, regType, start + count - 1, 0, 0xFFFFFFFFu));
    }

    first = false;
  }
  ASMJIT_PROPAGATE(sb.append('}'));

  return kErrorOk;
}